

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notifier.hpp
# Opt level: O0

void __thiscall tf::Notifier::_park(Notifier *this,Waiter *w)

{
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  Waiter *w_local;
  Notifier *this_local;
  
  lock._8_8_ = w;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&w->mu);
  while (*(int *)(lock._8_8_ + 0x68) != 2) {
    *(undefined4 *)(lock._8_8_ + 0x68) = 1;
    std::condition_variable::wait((unique_lock *)(lock._8_8_ + 0x30));
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void _park(Waiter* w) {
    std::unique_lock<std::mutex> lock(w->mu);
    while (w->state != Waiter::kSignaled) {
      w->state = Waiter::kWaiting;
      w->cv.wait(lock);
    }
  }